

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int entry_cmp(void *p1,void *p2)

{
  code *pcVar1;
  int c;
  entry *e2;
  entry *e1;
  void *p2_local;
  void *p1_local;
  
  pcVar1 = strcmp;
  if (ignore_case != 0) {
    pcVar1 = strcasecmp;
  }
  p1_local._4_4_ = (*pcVar1)(*p1,*p2);
  if (p1_local._4_4_ == 0) {
    if (*(long *)((long)p1 + 8) == *(long *)((long)p2 + 8)) {
      if (*(int *)((long)p1 + 0x10) == *(int *)((long)p2 + 0x10)) {
        p1_local._4_4_ = 0;
      }
      else {
        p1_local._4_4_ = *(int *)((long)p1 + 0x10) - *(int *)((long)p2 + 0x10);
      }
    }
    else if (*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8)) {
      p1_local._4_4_ = 1;
    }
    else {
      p1_local._4_4_ = -1;
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int
entry_cmp(const void *p1, const void *p2) {
    const struct entry *e1, *e2;
    int c;

    e1 = (struct entry *)p1;
    e2 = (struct entry *)p2;

    if ((c = (ignore_case ? strcasecmp : strcmp)(e1->name, e2->name)) != 0)
	return c;
    if (e1->size != e2->size) {
	if (e1->size > e2->size)
	    return 1;
	else
	    return -1;
    }
    if (e1->crc != e2->crc)
	return (int)e1->crc - (int)e2->crc;

    return 0;
}